

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O3

void uavs3d_ipred_ang_y_32_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 *puVar1;
  undefined8 *puVar2;
  pel *ppVar3;
  undefined1 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  uint uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [16];
  undefined1 *puVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 uStack_119;
  undefined8 auStack_118 [32];
  
  uVar16 = height / 2;
  uVar17 = (uVar16 + width) - 1;
  uVar8 = height;
  if ((int)uVar17 < height) {
    uVar8 = uVar17;
  }
  uVar22 = (long)(int)(uVar16 + width + 0x3e) & 0xfffffffffffffff0;
  if ((int)uVar8 < 5) {
    pauVar19 = (undefined1 (*) [16])(src + -0x12);
    uVar23 = 0;
  }
  else {
    uVar23 = 0;
    auVar25._8_2_ = 2;
    auVar25._0_8_ = 0x2000200020002;
    auVar25._10_2_ = 2;
    auVar25._12_2_ = 2;
    auVar25._14_2_ = 2;
    auVar25._16_2_ = 2;
    auVar25._18_2_ = 2;
    auVar25._20_2_ = 2;
    auVar25._22_2_ = 2;
    auVar25._24_2_ = 2;
    auVar25._26_2_ = 2;
    auVar25._28_2_ = 2;
    auVar25._30_2_ = 2;
    pauVar19 = (undefined1 (*) [16])(src + -0x13);
    do {
      pauVar18 = pauVar19;
      auVar27 = vpmovzxbw_avx2(*pauVar18);
      auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*pauVar18 + 1));
      auVar7 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*pauVar18 + 2));
      auVar27 = vpaddw_avx2(auVar27,auVar7);
      auVar6 = vpaddw_avx2(auVar6,auVar6);
      auVar27 = vpaddw_avx2(auVar27,auVar6);
      auVar27 = vpaddw_avx2(auVar27,auVar25);
      auVar27 = vpsrlw_avx2(auVar27,2);
      auVar24 = vpackuswb_avx(auVar27._0_16_,auVar27._16_16_);
      auVar5 = vpshufb_avx(auVar24,ZEXT816(0x1030507090b0d0f));
      auVar24 = vpshufb_avx(auVar24,ZEXT816(0x20406080a0c0e));
      *(long *)((long)auStack_118 + uVar23) = auVar5._0_8_;
      *(long *)((long)auStack_118 + uVar23 + uVar22) = auVar24._0_8_;
      uVar23 = uVar23 + 8;
      pauVar19 = pauVar18 + -1;
    } while (uVar23 < uVar8 - 4);
    pauVar19 = (undefined1 (*) [16])(pauVar18[-1] + 1);
  }
  if ((int)uVar23 < (int)uVar8) {
    auVar24 = vpunpckhbw_avx(*(undefined1 (*) [16])(pauVar19[-1] + 0xf),(undefined1  [16])0x0);
    auVar5 = vpunpckhbw_avx(*pauVar19,(undefined1  [16])0x0);
    auVar26 = vpunpckhbw_avx(*(undefined1 (*) [16])(*pauVar19 + 1),(undefined1  [16])0x0);
    auVar24 = vpaddw_avx(auVar26,auVar24);
    auVar5 = vpaddw_avx(auVar5,auVar5);
    auVar26._8_2_ = 2;
    auVar26._0_8_ = 0x2000200020002;
    auVar26._10_2_ = 2;
    auVar26._12_2_ = 2;
    auVar26._14_2_ = 2;
    auVar24 = vpaddw_avx(auVar24,auVar5);
    auVar24 = vpaddw_avx(auVar24,auVar26);
    auVar24 = vpsrlw_avx(auVar24,2);
    auVar24 = vpackuswb_avx(auVar24,auVar24);
    auVar5 = vpshufb_avx(auVar24,_DAT_00184600);
    auVar24 = vpshufb_avx(auVar24,_DAT_00184610);
    *(int *)((long)auStack_118 + (uVar23 & 0xffffffff)) = auVar24._0_4_;
    *(int *)((long)auStack_118 + (uVar23 & 0xffffffff) + uVar22) = auVar5._0_4_;
  }
  if (height < (int)uVar17) {
    uVar4 = (&uStack_119)[(long)(int)uVar8 + uVar22];
    puVar20 = (undefined1 *)((long)auStack_118 + (long)height);
    iVar21 = ~uVar8 + uVar16 + width;
    do {
      *puVar20 = uVar4;
      puVar20[1] = uVar4;
      puVar20[2] = uVar4;
      puVar20[3] = uVar4;
      puVar20[4] = uVar4;
      puVar20[5] = uVar4;
      puVar20[6] = uVar4;
      puVar20[7] = uVar4;
      puVar20[8] = uVar4;
      puVar20[9] = uVar4;
      puVar20[10] = uVar4;
      puVar20[0xb] = uVar4;
      puVar20[0xc] = uVar4;
      puVar20[0xd] = uVar4;
      puVar20[0xe] = uVar4;
      puVar20[0xf] = uVar4;
      puVar1 = puVar20 + uVar22;
      *puVar1 = uVar4;
      puVar1[1] = uVar4;
      puVar1[2] = uVar4;
      puVar1[3] = uVar4;
      puVar1[4] = uVar4;
      puVar1[5] = uVar4;
      puVar1[6] = uVar4;
      puVar1[7] = uVar4;
      puVar1[8] = uVar4;
      puVar1[9] = uVar4;
      puVar1[10] = uVar4;
      puVar1[0xb] = uVar4;
      puVar1[0xc] = uVar4;
      puVar1[0xd] = uVar4;
      puVar1[0xe] = uVar4;
      puVar1[0xf] = uVar4;
      puVar20 = puVar20 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  iVar21 = i_dst * 2;
  if (width < 0x10) {
    if (width == 4) {
      if (1 < height) {
        uVar23 = 0;
        do {
          *(undefined4 *)dst = *(undefined4 *)((long)auStack_118 + uVar23);
          *(undefined4 *)(dst + i_dst) = *(undefined4 *)((long)auStack_118 + uVar23 + uVar22);
          dst = dst + iVar21;
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
      }
    }
    else if ((width == 8) && (1 < height)) {
      uVar23 = 0;
      do {
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_118 + uVar23);
        *(undefined8 *)(dst + i_dst) = *(undefined8 *)((long)auStack_118 + uVar23 + uVar22);
        dst = dst + iVar21;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
  }
  else if (width == 0x10) {
    if (1 < height) {
      uVar23 = 0;
      do {
        uVar9 = *(undefined8 *)((long)auStack_118 + uVar23 + 8);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_118 + uVar23);
        *(undefined8 *)(dst + 8) = uVar9;
        puVar2 = (undefined8 *)((long)auStack_118 + uVar23 + uVar22);
        uVar9 = puVar2[1];
        *(undefined8 *)(dst + i_dst) = *puVar2;
        *(undefined8 *)(dst + i_dst + 8) = uVar9;
        dst = dst + iVar21;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
  }
  else if (width == 0x20) {
    if (1 < height) {
      uVar23 = 0;
      do {
        uVar9 = *(undefined8 *)((long)auStack_118 + uVar23 + 8);
        uVar10 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x10);
        uVar11 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_118 + uVar23);
        *(undefined8 *)(dst + 8) = uVar9;
        *(undefined8 *)(dst + 0x10) = uVar10;
        *(undefined8 *)(dst + 0x18) = uVar11;
        puVar2 = (undefined8 *)((long)auStack_118 + uVar23 + uVar22);
        uVar9 = puVar2[1];
        uVar10 = puVar2[2];
        uVar11 = puVar2[3];
        ppVar3 = dst + i_dst;
        *(undefined8 *)ppVar3 = *puVar2;
        *(undefined8 *)(ppVar3 + 8) = uVar9;
        *(undefined8 *)(ppVar3 + 0x10) = uVar10;
        *(undefined8 *)(ppVar3 + 0x18) = uVar11;
        dst = dst + iVar21;
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
  }
  else if ((width == 0x40) && (1 < height)) {
    uVar23 = 0;
    do {
      uVar9 = *(undefined8 *)((long)auStack_118 + uVar23);
      uVar10 = *(undefined8 *)((long)auStack_118 + uVar23 + 8);
      uVar11 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x10);
      uVar12 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x18);
      uVar13 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x28);
      uVar14 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x30);
      uVar15 = *(undefined8 *)((long)auStack_118 + uVar23 + 0x38);
      *(undefined8 *)(dst + 0x20) = *(undefined8 *)((long)auStack_118 + uVar23 + 0x20);
      *(undefined8 *)(dst + 0x28) = uVar13;
      *(undefined8 *)(dst + 0x30) = uVar14;
      *(undefined8 *)(dst + 0x38) = uVar15;
      *(undefined8 *)dst = uVar9;
      *(undefined8 *)(dst + 8) = uVar10;
      *(undefined8 *)(dst + 0x10) = uVar11;
      *(undefined8 *)(dst + 0x18) = uVar12;
      puVar2 = (undefined8 *)((long)auStack_118 + uVar23 + uVar22);
      uVar9 = *puVar2;
      uVar10 = puVar2[1];
      uVar11 = puVar2[2];
      uVar12 = puVar2[3];
      puVar2 = (undefined8 *)((long)auStack_118 + uVar23 + uVar22 + 0x20);
      uVar13 = puVar2[1];
      uVar14 = puVar2[2];
      uVar15 = puVar2[3];
      ppVar3 = dst + (long)i_dst + 0x20;
      *(undefined8 *)ppVar3 = *puVar2;
      *(undefined8 *)(ppVar3 + 8) = uVar13;
      *(undefined8 *)(ppVar3 + 0x10) = uVar14;
      *(undefined8 *)(ppVar3 + 0x18) = uVar15;
      ppVar3 = dst + i_dst;
      *(undefined8 *)ppVar3 = uVar9;
      *(undefined8 *)(ppVar3 + 8) = uVar10;
      *(undefined8 *)(ppVar3 + 0x10) = uVar11;
      *(undefined8 *)(ppVar3 + 0x18) = uVar12;
      dst = dst + iVar21;
      uVar23 = uVar23 + 1;
    } while (uVar16 != uVar23);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_y_32_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[2 * (64 + 64)]);
    int line_size = height / 2 + width - 1;
    int real_size = COM_MIN(line_size, height);
    int i;
    __m128i pad_val;
    int aligned_line_size = ((line_size + 63) >> 4) << 4;
    pel *pfirst[2];
    __m256i coeff2 = _mm256_set1_epi16(2);
    __m256i zero = _mm256_setzero_si256();
    __m128i shuffle1 = _mm_setr_epi8(15, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 0);
    __m128i shuffle2 = _mm_setr_epi8(14, 12, 10, 8, 6, 4, 2, 0, 15, 13, 11, 9, 7, 5, 3, 1);
    int i_dst2 = i_dst * 2;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

    src -= 18;

    for (i = 0; i < real_size - 4; i += 8, src -= 16) {
        __m256i p0, p1;
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);
        __m128i m0, d0, d1;

        p0 = _mm256_add_epi16(L0, L1);
        p1 = _mm256_add_epi16(L1, L2);
        p0 = _mm256_add_epi16(p0, coeff2);
        p0 = _mm256_add_epi16(p0, p1);
        p0 = _mm256_srli_epi16(p0, 2);

        m0 = _mm_packus_epi16(_mm256_castsi256_si128(p0), _mm256_extracti128_si256(p0, 1));
        d0 = _mm_shuffle_epi8(m0, shuffle1);
        d1 = _mm_shuffle_epi8(m0, shuffle2);
        _mm_storel_epi64((__m128i *)&pfirst[0][i], d0);
        _mm_storel_epi64((__m128i *)&pfirst[1][i], d1);
    }

    if (i < real_size) {
        __m128i coeff2 = _mm_set1_epi16(2);
        __m128i zero = _mm_setzero_si128();
        __m128i p10, p11;
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i H0 = _mm_unpackhi_epi8(S0, zero);
        __m128i H1 = _mm_unpackhi_epi8(S1, zero);
        __m128i H2 = _mm_unpackhi_epi8(S2, zero);

        p10 = _mm_add_epi16(H0, H1);
        p11 = _mm_add_epi16(H1, H2);
        p10 = _mm_add_epi16(p10, coeff2);
        p10 = _mm_add_epi16(p10, p11);
        p10 = _mm_srli_epi16(p10, 2);

        p11 = _mm_packus_epi16(p10, p10);
        p10 = _mm_shuffle_epi8(p11, shuffle2);
        p11 = _mm_shuffle_epi8(p11, shuffle1);
        ((int *)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p11);
        ((int *)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p10);
    }

    // padding
    if (real_size < line_size) {
        pad_val = _mm_set1_epi8((char)pfirst[1][real_size - 1]);
        for (i = real_size; i < line_size; i++) {
            _mm_storeu_si128((__m128i *)&pfirst[0][i], pad_val);
            _mm_storeu_si128((__m128i *)&pfirst[1][i], pad_val);
        }
    }

    height /= 2;

#define COPY_Y32(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, pfirst[0] + i, w * sizeof(pel)); \
        memcpy(dst + i_dst, pfirst[1] + i, w * sizeof(pel)); \
        dst += i_dst2;\
    } \
}
    switch (width) {
    case 4:
        COPY_Y32(4)
            break;
    case 8:
        COPY_Y32(8)
            break;
    case 16:
        COPY_Y32(16)
            break;
    case 32:
        COPY_Y32(32)
            break;
    case 64:
        COPY_Y32(64)
            break;
    }
}